

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int linsolve_wiener(int n,int64_t *A,int stride,int64_t *b,int64_t *x)

{
  int64_t iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int local_9c;
  long local_98;
  int local_90;
  int local_8c;
  int j_3;
  int64_t c_3;
  int i_2;
  int j_2;
  int64_t cd;
  int64_t c_2;
  int i_1;
  int scaler;
  int scaler_c;
  int scaler_A;
  int scale_threshold;
  int64_t abs_akj;
  int j_1;
  int64_t max_abs_akj;
  int64_t c;
  int64_t c_1;
  int j;
  int i;
  int k;
  int64_t *x_local;
  
  for (max_abs_akj._4_4_ = 0; max_abs_akj._4_4_ < n + -1; max_abs_akj._4_4_ = max_abs_akj._4_4_ + 1)
  {
    for (max_abs_akj._0_4_ = n + -1; max_abs_akj._4_4_ < (int)max_abs_akj;
        max_abs_akj._0_4_ = (int)max_abs_akj + -1) {
      lVar4 = A[((int)max_abs_akj + -1) * stride + max_abs_akj._4_4_];
      if (lVar4 < 1) {
        lVar4 = -lVar4;
      }
      lVar6 = A[(int)max_abs_akj * stride + max_abs_akj._4_4_];
      if (lVar6 < 1) {
        lVar6 = -lVar6;
      }
      if (lVar4 < lVar6) {
        for (j_1 = 0; j_1 < n; j_1 = j_1 + 1) {
          iVar1 = A[(int)max_abs_akj * stride + j_1];
          A[(int)max_abs_akj * stride + j_1] = A[((int)max_abs_akj + -1) * stride + j_1];
          A[((int)max_abs_akj + -1) * stride + j_1] = iVar1;
        }
        iVar1 = b[(int)max_abs_akj];
        b[(int)max_abs_akj] = b[(int)max_abs_akj + -1];
        b[(int)max_abs_akj + -1] = iVar1;
      }
    }
    _scaler = 0;
    for (i_1 = 0; i_1 < n; i_1 = i_1 + 1) {
      lVar4 = A[max_abs_akj._4_4_ * stride + i_1];
      if (lVar4 < 1) {
        lVar4 = -lVar4;
      }
      if (_scaler < lVar4) {
        _scaler = lVar4;
      }
    }
    iVar2 = 0x40;
    if (_scaler < 0x400000) {
      iVar2 = 1;
    }
    iVar3 = 0x80;
    if (_scaler < 0x400000) {
      iVar3 = 1;
    }
    for (c_3._4_4_ = max_abs_akj._4_4_; c_3._4_4_ < n + -1; c_3._4_4_ = c_3._4_4_ + 1) {
      if (A[max_abs_akj._4_4_ * stride + max_abs_akj._4_4_] == 0) {
        return 0;
      }
      lVar4 = A[(c_3._4_4_ + 1) * stride + max_abs_akj._4_4_];
      lVar6 = A[max_abs_akj._4_4_ * stride + max_abs_akj._4_4_];
      for (local_8c = 0; local_8c < n; local_8c = local_8c + 1) {
        iVar5 = (c_3._4_4_ + 1) * stride + local_8c;
        A[iVar5] = A[iVar5] -
                   (((A[max_abs_akj._4_4_ * stride + local_8c] / (long)iVar2) *
                    (lVar4 / (long)iVar3)) / lVar6) * (long)(iVar3 * iVar2);
      }
      b[c_3._4_4_ + 1] =
           b[c_3._4_4_ + 1] - (((lVar4 / (long)iVar3) * b[max_abs_akj._4_4_]) / lVar6) * (long)iVar3
      ;
    }
  }
  local_90 = n + -1;
  while( true ) {
    if (local_90 < 0) {
      return 1;
    }
    if (A[local_90 * stride + local_90] == 0) break;
    local_98 = 0;
    local_9c = local_90;
    while (local_9c = local_9c + 1, local_9c <= n + -1) {
      local_98 = (A[local_90 * stride + local_9c] * x[local_9c]) / 0x10000 + local_98;
    }
    x[local_90] = ((b[local_90] - local_98) * 0x10000) / A[local_90 * stride + local_90];
    local_90 = local_90 + -1;
  }
  return 0;
}

Assistant:

static int linsolve_wiener(int n, int64_t *A, int stride, int64_t *b,
                           int64_t *x) {
  for (int k = 0; k < n - 1; k++) {
    // Partial pivoting: bring the row with the largest pivot to the top
    for (int i = n - 1; i > k; i--) {
      // If row i has a better (bigger) pivot than row (i-1), swap them
      if (llabs(A[(i - 1) * stride + k]) < llabs(A[i * stride + k])) {
        for (int j = 0; j < n; j++) {
          const int64_t c = A[i * stride + j];
          A[i * stride + j] = A[(i - 1) * stride + j];
          A[(i - 1) * stride + j] = c;
        }
        const int64_t c = b[i];
        b[i] = b[i - 1];
        b[i - 1] = c;
      }
    }

    // b/278065963: The multiplies
    //   c / 256 * A[k * stride + j] / cd * 256
    // and
    //   c / 256 * b[k] / cd * 256
    // within Gaussian elimination can cause a signed integer overflow. Rework
    // the multiplies so that larger scaling is used without significantly
    // impacting the overall precision.
    //
    // Precision guidance:
    //   scale_threshold: Pick as high as possible.
    // For max_abs_akj >= scale_threshold scenario:
    //   scaler_A: Pick as low as possible. Needed for A[(i + 1) * stride + j].
    //   scaler_c: Pick as low as possible while maintaining scaler_c >=
    //     (1 << 7). Needed for A[(i + 1) * stride + j] and b[i + 1].
    int64_t max_abs_akj = 0;
    for (int j = 0; j < n; j++) {
      const int64_t abs_akj = llabs(A[k * stride + j]);
      if (abs_akj > max_abs_akj) max_abs_akj = abs_akj;
    }
    const int scale_threshold = 1 << 22;
    const int scaler_A = max_abs_akj < scale_threshold ? 1 : (1 << 6);
    const int scaler_c = max_abs_akj < scale_threshold ? 1 : (1 << 7);
    const int scaler = scaler_c * scaler_A;

    // Forward elimination (convert A to row-echelon form)
    for (int i = k; i < n - 1; i++) {
      if (A[k * stride + k] == 0) return 0;
      const int64_t c = A[(i + 1) * stride + k] / scaler_c;
      const int64_t cd = A[k * stride + k];
      for (int j = 0; j < n; j++) {
        A[(i + 1) * stride + j] -=
            A[k * stride + j] / scaler_A * c / cd * scaler;
      }
      b[i + 1] -= c * b[k] / cd * scaler_c;
    }
  }
  // Back-substitution
  for (int i = n - 1; i >= 0; i--) {
    if (A[i * stride + i] == 0) return 0;
    int64_t c = 0;
    for (int j = i + 1; j <= n - 1; j++) {
      c += A[i * stride + j] * x[j] / WIENER_TAP_SCALE_FACTOR;
    }
    // Store filter taps x in scaled form.
    x[i] = WIENER_TAP_SCALE_FACTOR * (b[i] - c) / A[i * stride + i];
  }

  return 1;
}